

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  size_t sVar1;
  ushort *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte *pbVar9;
  FILE *pFVar10;
  unsigned_long uVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  URLGlob *glob_00;
  ushort **ppuVar17;
  ulong uVar18;
  char **ppcVar19;
  char *__dest;
  int *piVar20;
  byte *pbVar21;
  anon_union_40_3_e2f18bb4_for_content *paVar22;
  ulong uVar23;
  byte *pbVar24;
  CURLcode CVar25;
  byte *pbVar26;
  long lVar27;
  char cVar28;
  int iVar29;
  anon_union_40_3_e2f18bb4_for_content *paVar30;
  URLPattern *pUVar31;
  anon_union_40_3_e2f18bb4_for_content *paVar32;
  size_t __n;
  byte **ppbVar33;
  char max_c;
  char min_c;
  char end_c;
  char *endp;
  char local_112;
  char local_111;
  anon_union_40_3_e2f18bb4_for_content *local_110;
  char local_101;
  anon_union_40_3_e2f18bb4_for_content *local_100;
  int local_f4;
  byte *local_f0;
  unsigned_long local_e8;
  URLPattern *local_e0;
  URLGlob *local_d8;
  unsigned_long *local_d0;
  FILE *local_c8;
  URLGlob **local_c0;
  byte *local_b8 [17];
  
  *glob = (URLGlob *)0x0;
  local_c8 = error;
  local_c0 = glob;
  sVar15 = strlen(url);
  pcVar16 = (char *)malloc(sVar15 + 1);
  if (pcVar16 != (char *)0x0) {
    *pcVar16 = '\0';
    local_e8 = 1;
    local_d0 = urlnum;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar15;
      glob_00->glob_buffer = pcVar16;
      paVar32 = (anon_union_40_3_e2f18bb4_for_content *)0x1;
      CVar25 = CURLE_OK;
      local_f4 = 0;
      local_d8 = glob_00;
LAB_00115d2d:
      if ((CVar25 == CURLE_OK) && (*url != 0)) {
        pbVar26 = (byte *)glob_00->glob_buffer;
        sVar15 = 0;
        local_110 = paVar32;
LAB_00115d4e:
        do {
          bVar12 = *url;
          if (bVar12 == 0x5b) {
            ppuVar17 = __ctype_b_loc();
            __n = 1;
            uVar18 = 0;
LAB_00115d6d:
            pbVar24 = (byte *)url + __n + 1;
            do {
              __n = __n + 1;
              bVar12 = pbVar24[-1];
              if (((*ppuVar17)[bVar12] & 8) == 0) {
                if (bVar12 < 0x2e) {
                  if (bVar12 != 0x25) goto LAB_00115e4a;
                }
                else if (bVar12 != 0x2e) goto LAB_00115d9d;
              }
              pbVar24 = pbVar24 + 1;
            } while( true );
          }
          if (0x5c < bVar12) {
            if (bVar12 != 0x5d) {
              if (bVar12 == 0x7b) goto LAB_00115e4c;
              if (bVar12 != 0x7d) goto LAB_00115e31;
            }
            pcVar16 = "unmatched close brace/bracket";
            paVar32 = local_110;
            goto LAB_0011666e;
          }
          if (bVar12 == 0) goto LAB_00115e4c;
          if (bVar12 == 0x5c) {
            pbVar24 = (byte *)url + 1;
            bVar12 = 0x5c;
            uVar14 = *pbVar24 - 0x5b;
            if ((uVar14 < 0x23) && ((0x500000005U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
              url = (char *)((byte *)url + 1);
              local_110 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_110 + 1);
              bVar12 = *pbVar24;
            }
          }
LAB_00115e31:
          url = (char *)((byte *)url + 1);
          *pbVar26 = bVar12;
          pbVar26 = pbVar26 + 1;
          local_110 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_110 + 1);
          sVar15 = sVar15 + 1;
        } while( true );
      }
      if (CVar25 == CURLE_OK) {
        *local_d0 = local_e8;
        *local_c0 = glob_00;
        return CURLE_OK;
      }
      goto LAB_0011668b;
    }
    free(pcVar16);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_00115d9d:
  if (bVar12 != 0x3a) goto LAB_00115da7;
  uVar18 = uVar18 + 1;
  goto LAB_00115d6d;
LAB_00115da7:
  if ((bVar12 != 0x5d) || (uVar18 < 2)) goto LAB_00115e4a;
  memcpy(pbVar26,url,__n);
  pbVar26 = pbVar26 + __n;
  sVar15 = sVar15 + __n;
  url = (char *)pbVar24;
  goto LAB_00115d4e;
LAB_00115e4a:
  bVar12 = 0x5b;
LAB_00115e4c:
  if (sVar15 != 0) {
    *pbVar26 = 0;
    sVar1 = glob_00->size;
    pcVar16 = glob_00->glob_buffer;
    glob_00->pattern[sVar1].type = UPTSet;
    glob_00->pattern[sVar1].globindex = -1;
    glob_00->pattern[sVar1].content.NumRange.max_n = 1;
    ppcVar19 = (char **)malloc(8);
    glob_00->pattern[sVar1].content.Set.elements = ppcVar19;
    if (ppcVar19 != (char **)0x0) {
      __dest = (char *)malloc(sVar15 + 1);
      *ppcVar19 = __dest;
      if (__dest != (char *)0x0) {
        memcpy(__dest,pcVar16,sVar15);
        __dest[sVar15] = '\0';
        CVar25 = CURLE_OK;
        paVar32 = local_110;
        uVar11 = local_e8;
        goto LAB_001160be;
      }
    }
    glob_00->error = "out of memory";
    glob_00->pos = 0;
    CVar25 = CURLE_OUT_OF_MEMORY;
    paVar32 = local_110;
    uVar11 = local_e8;
    goto LAB_001160be;
  }
  CVar25 = CURLE_OK;
  if (bVar12 != 0x5b) {
    paVar32 = local_110;
    uVar11 = local_e8;
    if (bVar12 == 0x7b) {
      local_f0 = (byte *)url + 1;
      sVar1 = glob_00->size;
      pbVar26 = (byte *)glob_00->glob_buffer;
      pUVar31 = glob_00->pattern + sVar1;
      glob_00->pattern[sVar1].type = UPTSet;
      paVar30 = &glob_00->pattern[sVar1].content;
      paVar32 = &glob_00->pattern[sVar1].content;
      (paVar32->Set).elements = (char **)0x0;
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar32->Set + 8))->min_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar32->Set + 8))->max_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar32->Set + 8))->ptr_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar32->Set + 8))->field_0x3 = 0;
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar32->Set + 8))->step = 0;
      glob_00->pattern[sVar1].globindex = local_f4;
      local_f4 = local_f4 + 1;
      lVar27 = 1;
      paVar22 = local_110;
      local_100 = paVar30;
      local_e0 = pUVar31;
      do {
        paVar32 = (anon_union_40_3_e2f18bb4_for_content *)((long)paVar22 + 1);
        bVar12 = ((byte *)url)[lVar27];
        if (bVar12 < 0x5c) {
          uVar11 = local_e8;
          if (bVar12 != 0x2c) {
            if (bVar12 != 0) {
              if (bVar12 != 0x5b) goto LAB_001160a6;
LAB_00116290:
              pcVar16 = "nested brace";
              goto LAB_00116338;
            }
            glob_00->error = "unmatched brace";
            glob_00->pos = (size_t)local_110;
            goto LAB_00116346;
          }
LAB_00115fda:
          local_e8 = uVar11;
          *pbVar26 = 0;
          if ((paVar30->Set).elements != (char **)0x0) {
            iVar13 = (pUVar31->content).Set.size;
            ppcVar19 = (char **)realloc((paVar30->Set).elements,(long)iVar13 * 8 + 8);
            glob_00 = local_d8;
            if (ppcVar19 != (char **)0x0) {
              (local_100->Set).elements = ppcVar19;
              goto LAB_00116032;
            }
LAB_001162be:
            glob_00->error = "out of memory";
            glob_00->pos = 0;
            CVar25 = CURLE_OUT_OF_MEMORY;
            url = (char *)local_f0;
            uVar11 = local_e8;
            break;
          }
          ppcVar19 = (char **)malloc(8);
          (paVar30->Set).elements = ppcVar19;
          if (ppcVar19 == (char **)0x0) {
            local_d8->error = "out of memory";
            local_d8->pos = 0;
            CVar25 = CURLE_OUT_OF_MEMORY;
            url = (char *)local_f0;
            glob_00 = local_d8;
            uVar11 = local_e8;
            break;
          }
          iVar13 = (pUVar31->content).Set.size;
LAB_00116032:
          glob_00 = local_d8;
          pcVar16 = strdup(local_d8->glob_buffer);
          ppcVar19[iVar13] = pcVar16;
          if (pcVar16 == (char *)0x0) goto LAB_001162be;
          (local_e0->content).Set.size = iVar13 + 1;
          if (((byte *)url)[lVar27] == 0x7d) {
            CVar25 = CURLE_OK;
            url = (char *)((byte *)url + lVar27 + 1);
            uVar11 = local_e8;
            break;
          }
          pbVar26 = (byte *)glob_00->glob_buffer;
          paVar30 = local_100;
          pUVar31 = local_e0;
          paVar22 = paVar32;
        }
        else {
          if (bVar12 < 0x7b) {
            if (bVar12 == 0x5c) {
              bVar12 = ((byte *)url)[lVar27 + 1];
              if (bVar12 == 0) {
                bVar12 = 0x5c;
              }
              else {
                lVar27 = lVar27 + 1;
                paVar32 = (anon_union_40_3_e2f18bb4_for_content *)((long)paVar22 + 2);
              }
            }
            else if (bVar12 == 0x5d) goto LAB_0011630c;
          }
          else {
            if (bVar12 == 0x7d) {
              if (lVar27 != 1) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = (long)(pUVar31->content).Set.size + 1;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = local_e8;
                uVar11 = SUB168(auVar3 * auVar6,0);
                if (SUB168(auVar3 * auVar6,8) == 0) goto LAB_00115fda;
                glob_00->error = "range overflow";
                glob_00->pos = 0;
                goto LAB_00116346;
              }
              pcVar16 = "empty string within braces";
              goto LAB_00116338;
            }
            if (bVar12 == 0x7b) goto LAB_00116290;
          }
LAB_001160a6:
          *pbVar26 = bVar12;
          pbVar26 = pbVar26 + 1;
          paVar22 = paVar32;
        }
        lVar27 = lVar27 + 1;
      } while( true );
    }
    goto LAB_001160be;
  }
  pbVar26 = (byte *)url + 1;
  local_100 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_110 + 1);
  pUVar31 = glob_00->pattern + glob_00->size;
  glob_00->pattern[glob_00->size].globindex = local_f4;
  local_f4 = local_f4 + 1;
  ppuVar17 = __ctype_b_loc();
  puVar2 = *ppuVar17;
  local_e0 = pUVar31;
  if ((puVar2[((byte *)url)[1]] >> 10 & 1) == 0) {
    if ((puVar2[((byte *)url)[1]] >> 0xb & 1) != 0) {
      pUVar31->type = UPTNumRange;
      (pUVar31->content).NumRange.padlength = 0;
      if ((*pbVar26 == 0x30) && ((*(byte *)((long)puVar2 + 0x61) & 8) != 0)) {
        lVar27 = 2;
        do {
          (pUVar31->content).NumRange.padlength = (int)lVar27 + -1;
          pbVar24 = (byte *)url + lVar27;
          lVar27 = lVar27 + 1;
        } while ((*(byte *)((long)puVar2 + (ulong)*pbVar24 * 2 + 1) & 8) != 0);
      }
      piVar20 = __errno_location();
      *piVar20 = 0;
      pbVar21 = (byte *)strtoul((char *)pbVar26,(char **)local_b8,10);
      pbVar24 = pbVar26;
      if (((*piVar20 == 0) && (local_b8[0] != pbVar26)) &&
         (pbVar9 = local_b8[0], *local_b8[0] == 0x2d)) {
        do {
          do {
            pbVar24 = pbVar9 + 1;
            bVar12 = *pbVar24;
            pbVar9 = pbVar24;
          } while (bVar12 == 0x20);
        } while (bVar12 == 9);
        if ((*(byte *)((long)*ppuVar17 + (ulong)bVar12 * 2 + 1) & 8) == 0) goto LAB_00116266;
        *piVar20 = 0;
        paVar22 = (anon_union_40_3_e2f18bb4_for_content *)
                  strtoul((char *)pbVar24,(char **)local_b8,10);
        if ((*piVar20 != 0) || (*local_b8[0] == 0x3a)) {
          pbVar24 = local_b8[0] + 1;
          *piVar20 = 0;
          local_110 = paVar22;
          uVar18 = strtoul((char *)pbVar24,(char **)local_b8,10);
          if ((*piVar20 != 0) || ((local_b8[0] == (byte *)0x0 || (*local_b8[0] != 0x5d))))
          goto LAB_00116266;
          url = (char *)(local_b8[0] + 1);
          paVar32 = (anon_union_40_3_e2f18bb4_for_content *)
                    ((long)local_100 + ((long)url - (long)pbVar26));
          if (uVar18 != 0) {
            if ((anon_union_40_3_e2f18bb4_for_content *)pbVar21 != local_110 || uVar18 == 1) {
              paVar22 = local_110;
              if (local_110 != (anon_union_40_3_e2f18bb4_for_content *)pbVar21) goto LAB_001165c9;
              uVar23 = 0;
              goto LAB_001165e5;
            }
            pcVar16 = "bad range";
            goto LAB_00116278;
          }
          goto LAB_00116271;
        }
        if (*local_b8[0] != 0x5d) goto LAB_00116266;
        url = (char *)(local_b8[0] + 1);
        paVar32 = (anon_union_40_3_e2f18bb4_for_content *)
                  ((long)local_100 + ((long)url - (long)pbVar26));
        uVar18 = 1;
        if (paVar22 == (anon_union_40_3_e2f18bb4_for_content *)pbVar21) {
          uVar23 = 0;
        }
        else {
LAB_001165c9:
          uVar23 = (long)paVar22 - (long)pbVar21;
          if (paVar22 < pbVar21) goto LAB_00116271;
          pcVar16 = "bad range";
          if (uVar23 < uVar18) goto LAB_00116278;
        }
LAB_001165e5:
        (local_e0->content).NumRange.min_n = (unsigned_long)pbVar21;
        (local_e0->content).NumRange.ptr_n = (unsigned_long)pbVar21;
        (local_e0->content).NumRange.max_n = (unsigned_long)paVar22;
        (local_e0->content).NumRange.step = uVar18;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar23 / uVar18 + 1;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_e8;
        uVar11 = SUB168(auVar5 * auVar8,0);
        if (SUB168(auVar5 * auVar8,8) == 0) goto LAB_001160be;
        pcVar16 = "range overflow";
      }
      else {
LAB_00116266:
        paVar32 = (anon_union_40_3_e2f18bb4_for_content *)
                  (pbVar24 + ((long)local_100 - (long)pbVar26));
LAB_00116271:
        pcVar16 = "bad range";
      }
LAB_00116278:
      glob_00->error = pcVar16;
      glob_00->pos = (size_t)paVar32;
      CVar25 = CURLE_URL_MALFORMAT;
      url = (char *)pbVar26;
      uVar11 = local_e8;
      goto LAB_001160be;
    }
    glob_00->error = "bad range specification";
    glob_00->pos = (size_t)local_100;
    paVar32 = local_100;
  }
  else {
    pUVar31->type = UPTCharRange;
    iVar13 = __isoc99_sscanf(pbVar26,"%c-%c%c",&local_111,&local_112,&local_101);
    if (iVar13 == 3) {
      if (local_101 != ']') {
        if (local_101 == ':') {
          piVar20 = __errno_location();
          *piVar20 = 0;
          uVar18 = strtoul((char *)((byte *)url + 5),(char **)local_b8,10);
          if ((*piVar20 == 0) && ((byte *)url + 5 != local_b8[0])) {
            url = (char *)(local_b8[0] + 1);
            if (*local_b8[0] != 0x5d) {
              url = (char *)pbVar26;
            }
            paVar32 = (anon_union_40_3_e2f18bb4_for_content *)
                      ((long)local_100 + ((long)url - (long)pbVar26));
            if (((*local_b8[0] != 0x5d) || (uVar18 - 0x80000000 < 0xffffffff80000001)) ||
               (uVar18 != 1 && local_111 == local_112)) goto LAB_00116479;
            iVar29 = (int)local_111;
            iVar13 = (int)local_112;
            if (local_111 != local_112) goto LAB_00116470;
            goto LAB_00116380;
          }
        }
        goto LAB_001161d6;
      }
      url = (char *)((byte *)url + 5);
      paVar32 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_110 + 5);
      iVar29 = (int)local_111;
      iVar13 = (int)local_112;
      uVar18 = 1;
      if (local_111 == local_112) {
LAB_00116380:
        uVar14 = iVar13 - iVar29;
        cVar28 = local_111;
LAB_00116384:
        (local_e0->content).CharRange.step = (int)uVar18;
        (local_e0->content).CharRange.min_c = local_111;
        (local_e0->content).CharRange.ptr_c = local_111;
        (local_e0->content).CharRange.max_c = cVar28;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)((int)uVar14 / (int)uVar18 + 1);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_e8;
        uVar11 = SUB168(auVar4 * auVar7,0);
        if (SUB168(auVar4 * auVar7,8) == 0) goto LAB_001160be;
        pcVar16 = "range overflow";
      }
      else {
LAB_00116470:
        if (local_111 <= local_112) {
          uVar14 = iVar13 - iVar29;
          if ((int)uVar14 < 0x1a) {
            pcVar16 = "bad range";
            cVar28 = local_112;
            if (uVar18 <= uVar14) goto LAB_00116384;
            goto LAB_001161e2;
          }
        }
LAB_00116479:
        pcVar16 = "bad range";
      }
    }
    else {
LAB_001161d6:
      pcVar16 = "bad range";
      paVar32 = local_100;
    }
LAB_001161e2:
    glob_00->error = pcVar16;
    glob_00->pos = (size_t)paVar32;
  }
  CVar25 = CURLE_URL_MALFORMAT;
  url = (char *)pbVar26;
  uVar11 = local_e8;
LAB_001160be:
  local_e8 = uVar11;
  uVar18 = glob_00->size + 1;
  glob_00->size = uVar18;
  if (99 < uVar18) {
    pcVar16 = "too many globs";
LAB_0011666e:
    glob_00->error = pcVar16;
    glob_00->pos = (size_t)paVar32;
    CVar25 = CURLE_URL_MALFORMAT;
LAB_0011668b:
    pFVar10 = local_c8;
    if ((local_c8 != (FILE *)0x0) && (ppbVar33 = (byte **)glob_00->error, ppbVar33 != (byte **)0x0))
    {
      if (glob_00->pos != 0) {
        curl_msnprintf(local_b8,0x80,"%s in column %zu");
        ppbVar33 = local_b8;
      }
      curl_mfprintf(pFVar10,"curl: (%d) [globbing] %s\n",CVar25,ppbVar33);
    }
    glob_cleanup(glob_00);
    *local_d0 = 1;
    return CVar25;
  }
  goto LAB_00115d2d;
LAB_0011630c:
  pcVar16 = "unexpected close bracket";
LAB_00116338:
  glob_00->error = pcVar16;
  glob_00->pos = (size_t)paVar32;
LAB_00116346:
  CVar25 = CURLE_URL_MALFORMAT;
  url = (char *)local_f0;
  uVar11 = local_e8;
  goto LAB_001160be;
}

Assistant:

CURLcode glob_url(URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0]=0;

  glob_expand = calloc(1, sizeof(URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[128];
      const char *t;
      if(glob_expand->pos) {
        snprintf(text, sizeof(text), "%s in column %zu", glob_expand->error,
                 glob_expand->pos);
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) [globbing] %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}